

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O0

uint32_t rest_rpc::MD5::MD5CE::GetPaddedMessageWord(char *data,uint32_t n,uint32_t m,uint32_t i)

{
  byte bVar1;
  uint m_00;
  uint n_00;
  uint uVar2;
  undefined4 in_ECX;
  uint32_t in_stack_ffffffffffffffdc;
  uint32_t in_stack_ffffffffffffffe0;
  uint32_t in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  bVar1 = GetPaddedMessageByte
                    ((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,
                     in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  m_00 = (uint)bVar1;
  bVar1 = GetPaddedMessageByte
                    ((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,
                     m_00,in_stack_ffffffffffffffdc);
  n_00 = m_00 | (uint)bVar1 << 8;
  bVar1 = GetPaddedMessageByte
                    ((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),n_00,m_00,
                     in_stack_ffffffffffffffdc);
  uVar2 = n_00 | (uint)bVar1 << 0x10;
  bVar1 = GetPaddedMessageByte((char *)CONCAT44(in_ECX,uVar2),n_00,m_00,in_stack_ffffffffffffffdc);
  return uVar2 | (uint)bVar1 << 0x18;
}

Assistant:

static uint32_t GetPaddedMessageWord(const char *data, const uint32_t n,
                                       const uint32_t m, const uint32_t i) {
    //    DCHECK_EQ(i % 4, 0u);
    //    DCHECK_LT(i, m);
    //    DCHECK_LT(n, m);
    //    DCHECK_EQ(m % 64, 0u);
    return static_cast<uint32_t>(GetPaddedMessageByte(data, n, m, i)) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 1))
                                 << 8) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 2))
                                 << 16) |
           static_cast<uint32_t>((GetPaddedMessageByte(data, n, m, i + 3))
                                 << 24);
  }